

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O1

void __thiscall CJsonWriter::WriteIntValue(CJsonWriter *this,int Value)

{
  IOHANDLE io;
  bool bVar1;
  uint size;
  long in_FS_OFFSET;
  char aBuf [32];
  char acStack_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CanWriteDatatype(this);
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/jsonwriter.cpp"
                 ,0x58,(uint)bVar1,"Cannot write value at this position");
  WriteIndent(this,false);
  str_format(acStack_48,0x20,"%d",Value);
  io = this->m_IO;
  size = str_length(acStack_48);
  io_write(io,acStack_48,size);
  CompleteDataType(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CJsonWriter::WriteIntValue(int Value)
{
	dbg_assert(CanWriteDatatype(), "Cannot write value at this position");
	WriteIndent(false);
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d", Value);
	WriteInternal(aBuf);
	CompleteDataType();
}